

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

_Bool ssh_ecdhkex_m_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  uint8_t val;
  uint uVar1;
  strbuf *sb_00;
  ptrlen bytes;
  ulong local_68;
  size_t i;
  strbuf *sb;
  mp_int *x;
  MontgomeryPoint *p;
  MontgomeryPoint *remote_p;
  mp_int *remote_x;
  ecdh_key_m *dhm;
  BinarySink *bs_local;
  ecdh_key *dh_local;
  ptrlen remoteKey_local;
  
  remoteKey_local.ptr = (void *)remoteKey.len;
  dh_local = (ecdh_key *)remoteKey.ptr;
  remote_x = (mp_int *)(dh + -4);
  dhm = (ecdh_key_m *)bs;
  bs_local = (BinarySink *)dh;
  remote_p = (MontgomeryPoint *)mp_from_bytes_le(remoteKey);
  mp_reduce_mod_2to((mp_int *)remote_p,remote_x->w[3]);
  p = ecc_montgomery_point_new((MontgomeryCurve *)remote_x->w[6],(mp_int *)remote_p);
  mp_free((mp_int *)remote_p);
  x = (mp_int *)ecc_montgomery_multiply(p,(mp_int *)remote_x[1].nw);
  uVar1 = ecc_montgomery_is_identity((MontgomeryPoint *)x);
  if (uVar1 == 0) {
    ecc_montgomery_get_affine((MontgomeryPoint *)x,(mp_int **)&sb);
    ecc_montgomery_point_free(p);
    ecc_montgomery_point_free((MontgomeryPoint *)x);
    sb_00 = strbuf_new();
    for (local_68 = 0; local_68 < remote_x->w[4]; local_68 = local_68 + 1) {
      val = mp_get_byte((mp_int *)sb,local_68);
      BinarySink_put_byte(sb_00->binarysink_,val);
    }
    mp_free((mp_int *)sb);
    bytes = ptrlen_from_strbuf(sb_00);
    sb = (strbuf *)mp_from_bytes_be(bytes);
    strbuf_free(sb_00);
    BinarySink_put_mp_ssh2((BinarySink *)dhm->private,(mp_int *)sb);
    mp_free((mp_int *)sb);
    remoteKey_local.len._7_1_ = true;
  }
  else {
    ecc_montgomery_point_free(p);
    ecc_montgomery_point_free((MontgomeryPoint *)x);
    remoteKey_local.len._7_1_ = false;
  }
  return remoteKey_local.len._7_1_;
}

Assistant:

static bool ssh_ecdhkex_m_getkey(ecdh_key *dh, ptrlen remoteKey,
                                 BinarySink *bs)
{
    ecdh_key_m *dhm = container_of(dh, ecdh_key_m, ek);

    mp_int *remote_x = mp_from_bytes_le(remoteKey);

    /* Per RFC 7748 section 5, discard any set bits of the other
     * side's public value beyond the minimum number of bits required
     * to represent all valid values. However, an overlarge value that
     * still fits into the remaining number of bits is accepted, and
     * will be reduced mod p. */
    mp_reduce_mod_2to(remote_x, dhm->curve->fieldBits);

    MontgomeryPoint *remote_p = ecc_montgomery_point_new(
        dhm->curve->m.mc, remote_x);
    mp_free(remote_x);

    MontgomeryPoint *p = ecc_montgomery_multiply(remote_p, dhm->private);

    if (ecc_montgomery_is_identity(p)) {
        ecc_montgomery_point_free(remote_p);
        ecc_montgomery_point_free(p);
        return false;
    }

    mp_int *x;
    ecc_montgomery_get_affine(p, &x);

    ecc_montgomery_point_free(remote_p);
    ecc_montgomery_point_free(p);

    /*
     * Endianness-swap. The Curve25519 algorithm definition assumes
     * you were doing your computation in arrays of 32 little-endian
     * bytes, and now specifies that you take your final one of those
     * and convert it into a bignum in _network_ byte order, i.e.
     * big-endian.
     *
     * In particular, the spec says, you convert the _whole_ 32 bytes
     * into a bignum. That is, on the rare occasions that x has come
     * out with the most significant 8 bits zero, we have to imagine
     * that being represented by a 32-byte string with the last byte
     * being zero, so that has to be converted into an SSH-2 bignum
     * with the _low_ byte zero, i.e. a multiple of 256.
     */
    strbuf *sb = strbuf_new();
    for (size_t i = 0; i < dhm->curve->fieldBytes; ++i)
        put_byte(sb, mp_get_byte(x, i));
    mp_free(x);
    x = mp_from_bytes_be(ptrlen_from_strbuf(sb));
    strbuf_free(sb);
    put_mp_ssh2(bs, x);
    mp_free(x);

    return true;
}